

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

Gia_Man_t * Gia_ManDupPosAndPropagateInit(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  long lVar14;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  if (1 < p->nObjs) {
    lVar13 = 1;
    lVar14 = 0x14;
    do {
      pGVar4 = p->pObjs;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      uVar7 = (uint)uVar5;
      iVar8 = (int)(uVar5 & 0x1fffffff);
      uVar2 = (uint)(uVar5 >> 0x20);
      if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
        if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
          if ((int)(uVar2 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
            pGVar11 = Gia_ManAppendObj(p_00);
            uVar5 = *(ulong *)pGVar11;
            *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
            *(ulong *)pGVar11 =
                 uVar5 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar6 = p_00->pObjs;
            if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_005268d5:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
            pGVar6 = p_00->pObjs;
            if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005268d5;
            *(int *)(&pGVar4->field_0x0 + lVar14) =
                 (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
          }
          else {
            *(undefined4 *)(&pGVar4->field_0x0 + lVar14) = 0;
          }
        }
        else if ((iVar8 != 0x1fffffff && (int)uVar7 < 0) &&
                ((int)(uVar2 & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
          uVar2 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)(iVar8 << 2) * -3);
          if ((int)uVar2 < 0) goto LAB_005268b6;
          Gia_ManAppendCo(p_00,uVar2 ^ uVar7 >> 0x1d & 1);
        }
      }
      else {
        uVar7 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)(iVar8 << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) {
LAB_005268b6:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        iVar8 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar5 >> 0x1d) & 1,uVar1 ^ uVar2 >> 0x1d & 1);
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar8;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar13 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  if (p->vCis->nSize - p->nRegs != p_00->vCis->nSize - p_00->nRegs) {
    __assert_fail("Gia_ManPiNum(p) == Gia_ManPiNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                  ,0xb4,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
  }
  if (p->vCos->nSize - p->nRegs != p_00->vCos->nSize - p_00->nRegs) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPoNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                  ,0xb5,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManDupPosAndPropagateInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = 0;
        else if ( Gia_ObjIsPo(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    assert( Gia_ManPiNum(p) == Gia_ManPiNum(pNew) );
    assert( Gia_ManPoNum(p) == Gia_ManPoNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}